

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O1

pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
Cmaes::eig(pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           *__return_storage_ptr__,Cmaes *this,MatrixXd *A,MatrixXd *B)

{
  DenseStorage<double,__1,__1,__1,_0> *other;
  undefined1 local_80 [8];
  GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> solver;
  MatrixXd V;
  VectorXd D;
  
  Eigen::GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::
  GeneralizedSelfAdjointEigenSolver
            ((GeneralizedSelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             local_80,A,B,0x180);
  other = (DenseStorage<double,__1,__1,__1,_0> *)
          Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                    ((SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_80);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)
             &solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_info,
             other);
  if (solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_subdiag.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_1_ != '\0')
  {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               &V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               (DenseStorage<double,__1,__1,_1,_0> *)
               &solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols);
    std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
    pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_&,_true>
              (__return_storage_ptr__,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_info,(Matrix<double,__1,_1,_0,__1,_1> *)
                       &V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_cols);
    free((void *)V.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        );
    free((void *)solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 _56_8_);
    free((void *)solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_rows);
    free((void *)solver.super_SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols);
    free((void *)local_80);
    return __return_storage_ptr__;
  }
  __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h"
                ,0x11c,
                "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

std::pair<MatrixXd, VectorXd> Cmaes::eig(const MatrixXd& A, const MatrixXd& B)
{
	Eigen::GeneralizedSelfAdjointEigenSolver<MatrixXd> solver(A, B);
	MatrixXd V = solver.eigenvectors();
	VectorXd D = solver.eigenvalues();

	return std::make_pair(V, D);
}